

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawRect(int x1,int y1,int x2,int y2,Canvas *ptr)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  if (ptr != (Canvas *)0x0) {
    uVar6 = (ulong)(uint)x1;
    if (x1 < 1) {
      uVar6 = 0;
    }
    iVar1 = ptr->width;
    if (iVar1 < x2) {
      x2 = iVar1;
    }
    uVar3 = 0;
    if (0 < y1) {
      uVar3 = (ulong)(uint)y1;
    }
    uVar5 = ((long)iVar1 * uVar3 + uVar6) * 0x10 | 0xc;
    for (; (long)uVar6 < (long)x2; uVar6 = uVar6 + 1) {
      iVar7 = ptr->height;
      if (y2 <= ptr->height) {
        iVar7 = y2;
      }
      uVar8 = uVar5;
      for (uVar4 = uVar3; (long)uVar4 < (long)iVar7; uVar4 = uVar4 + 1) {
        pcVar2 = (ptr->data).ptr;
        *(float *)(pcVar2 + (uVar8 - 0xc)) = ptr->color[0];
        *(float *)(pcVar2 + (uVar8 - 8)) = ptr->color[1];
        *(float *)(pcVar2 + (uVar8 - 4)) = ptr->color[2];
        *(float *)(pcVar2 + uVar8) = ptr->color[3];
        uVar8 = uVar8 + (long)iVar1 * 0x10;
      }
      uVar5 = uVar5 + 0x10;
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasDrawRect(int x1, int y1, int x2, int y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 0] = ptr->color[0];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 1] = ptr->color[1];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 2] = ptr->color[2];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 3] = ptr->color[3];
			}
		}
	}